

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O0

char * __thiscall icu_63::UDataPathIterator::next(UDataPathIterator *this,UErrorCode *pErrorCode)

{
  undefined8 uVar1;
  undefined4 uVar2;
  UBool UVar3;
  char cVar4;
  int iVar5;
  int32_t iVar6;
  char *pcVar7;
  size_t sVar8;
  CharString *this_00;
  char *pcVar9;
  char *pcVar10;
  __off_t __length;
  StringPiece s;
  char *pathBasename;
  int32_t pathLen;
  char *currentPath;
  UErrorCode *pErrorCode_local;
  UDataPathIterator *this_local;
  
  UVar3 = ::U_FAILURE(*pErrorCode);
  if (UVar3 == '\0') {
    do {
      if (this->nextPath == (char *)0x0) {
        return (char *)0x0;
      }
      pcVar9 = this->nextPath;
      pcVar10 = this->nextPath;
      pcVar7 = CharString::data(&this->itemPath);
      if (pcVar10 == pcVar7) {
        this->nextPath = this->path;
        sVar8 = strlen(pcVar9);
        pathBasename._4_4_ = (int)sVar8;
      }
      else {
        pcVar10 = strchr(pcVar9,0x3a);
        this->nextPath = pcVar10;
        if (this->nextPath == (char *)0x0) {
          sVar8 = strlen(pcVar9);
          pathBasename._4_4_ = (int)sVar8;
        }
        else {
          pathBasename._4_4_ = (int)this->nextPath - (int)pcVar9;
          this->nextPath = this->nextPath + 1;
        }
      }
      if (pathBasename._4_4_ != 0) {
        this_00 = CharString::clear(&this->pathBuffer);
        CharString::append(this_00,pcVar9,pathBasename._4_4_,pErrorCode);
        pcVar9 = CharString::data(&this->pathBuffer);
        pcVar9 = findBasename(pcVar9);
        if ((this->checkLastFour == '\x01') && (3 < pathBasename._4_4_)) {
          pcVar10 = CharString::data(&this->pathBuffer);
          pcVar7 = StringPiece::data(&this->suffix);
          iVar5 = strncmp(pcVar10 + (pathBasename._4_4_ + -4),pcVar7,4);
          if (iVar5 == 0) {
            pcVar10 = CharString::data(&this->pathBuffer);
            pcVar10 = findBasename(pcVar10);
            iVar5 = strncmp(pcVar10,this->basename,(ulong)this->basenameLen);
            if ((iVar5 == 0) && (sVar8 = strlen(pcVar9), sVar8 == this->basenameLen + 4))
            goto LAB_00458bd8;
          }
        }
        cVar4 = CharString::operator[](&this->pathBuffer,pathBasename._4_4_ + -1);
        if (cVar4 != '/') {
          if (3 < pathBasename._4_4_) {
            pcVar9 = CharString::data(&this->pathBuffer);
            iVar5 = strncmp(pcVar9 + (pathBasename._4_4_ + -4),".dat",4);
            if (iVar5 == 0) goto LAB_00458beb;
          }
          UVar3 = CharString::isEmpty(&this->packageStub);
          if ((UVar3 == '\0') &&
             (iVar6 = CharString::length(&this->packageStub), iVar6 < pathBasename._4_4_)) {
            pcVar9 = CharString::data(&this->pathBuffer);
            iVar6 = CharString::length(&this->packageStub);
            pcVar10 = CharString::data(&this->packageStub);
            iVar5 = strcmp(pcVar9 + ((long)pathBasename._4_4_ - (long)iVar6),pcVar10);
            if (iVar5 == 0) {
              iVar6 = CharString::length(&this->packageStub);
              CharString::truncate
                        (&this->pathBuffer,(char *)(ulong)(uint)(pathBasename._4_4_ - iVar6),
                         __length);
            }
          }
          CharString::append(&this->pathBuffer,'/',pErrorCode);
        }
        pcVar9 = CharString::data(&this->packageStub);
        iVar6 = CharString::length(&this->packageStub);
        CharString::append(&this->pathBuffer,pcVar9 + 1,iVar6 + -1,pErrorCode);
        UVar3 = StringPiece::empty(&this->suffix);
        if (UVar3 == '\0') {
          iVar6 = StringPiece::length(&this->suffix);
          if (4 < iVar6) {
            CharString::ensureEndsWithFileSeparator(&this->pathBuffer,pErrorCode);
          }
          uVar1 = (this->suffix).ptr_;
          uVar2 = (this->suffix).length_;
          s.length_ = uVar2;
          s.ptr_ = (char *)uVar1;
          s._12_4_ = 0;
          CharString::append(&this->pathBuffer,s,pErrorCode);
        }
LAB_00458bd8:
        pcVar9 = CharString::data(&this->pathBuffer);
        return pcVar9;
      }
LAB_00458beb:
    } while (this->path != (char *)0x0);
  }
  return (char *)0x0;
}

Assistant:

const char *UDataPathIterator::next(UErrorCode *pErrorCode)
{
    if(U_FAILURE(*pErrorCode)) {
        return NULL;
    }

    const char *currentPath = NULL;
    int32_t     pathLen = 0;
    const char *pathBasename;

    do
    {
        if( nextPath == NULL ) {
            break;
        }
        currentPath = nextPath;

        if(nextPath == itemPath.data()) { /* we were processing item's path. */
            nextPath = path; /* start with regular path next tm. */
            pathLen = (int32_t)uprv_strlen(currentPath);
        } else {
            /* fix up next for next time */
            nextPath = uprv_strchr(currentPath, U_PATH_SEP_CHAR);
            if(nextPath == NULL) {
                /* segment: entire path */
                pathLen = (int32_t)uprv_strlen(currentPath); 
            } else {
                /* segment: until next segment */
                pathLen = (int32_t)(nextPath - currentPath);
                /* skip divider */
                nextPath ++;
            }
        }

        if(pathLen == 0) {
            continue;
        }

#ifdef UDATA_DEBUG
        fprintf(stderr, "rest of path (IDD) = %s\n", currentPath);
        fprintf(stderr, "                     ");
        { 
            uint32_t qqq;
            for(qqq=0;qqq<pathLen;qqq++)
            {
                fprintf(stderr, " ");
            }

            fprintf(stderr, "^\n");
        }
#endif
        pathBuffer.clear().append(currentPath, pathLen, *pErrorCode);

        /* check for .dat files */
        pathBasename = findBasename(pathBuffer.data());

        if(checkLastFour == TRUE && 
           (pathLen>=4) &&
           uprv_strncmp(pathBuffer.data() +(pathLen-4), suffix.data(), 4)==0 && /* suffix matches */
           uprv_strncmp(findBasename(pathBuffer.data()), basename, basenameLen)==0  && /* base matches */
           uprv_strlen(pathBasename)==(basenameLen+4)) { /* base+suffix = full len */

#ifdef UDATA_DEBUG
            fprintf(stderr, "Have %s file on the path: %s\n", suffix, pathBuffer.data());
#endif
            /* do nothing */
        }
        else 
        {       /* regular dir path */
            if(pathBuffer[pathLen-1] != U_FILE_SEP_CHAR) {
                if((pathLen>=4) &&
                   uprv_strncmp(pathBuffer.data()+(pathLen-4), ".dat", 4) == 0)
                {
#ifdef UDATA_DEBUG
                    fprintf(stderr, "skipping non-directory .dat file %s\n", pathBuffer.data());
#endif
                    continue;
                }

                /* Check if it is a directory with the same name as our package */
                if(!packageStub.isEmpty() &&
                   (pathLen > packageStub.length()) &&
                   !uprv_strcmp(pathBuffer.data() + pathLen - packageStub.length(), packageStub.data())) {
#ifdef UDATA_DEBUG
                  fprintf(stderr, "Found stub %s (will add package %s of len %d)\n", packageStub.data(), basename, basenameLen);
#endif
                  pathBuffer.truncate(pathLen - packageStub.length());
                }
                pathBuffer.append(U_FILE_SEP_CHAR, *pErrorCode);
            }

            /* + basename */
            pathBuffer.append(packageStub.data()+1, packageStub.length()-1, *pErrorCode);

            if (!suffix.empty())  /* tack on suffix */
            {
                if (suffix.length() > 4) {
                    // If the suffix is actually an item ("ibm-5348_P100-1997.cnv") and not an extension (".res")
                    // then we need to ensure that the path ends with a separator.
                    pathBuffer.ensureEndsWithFileSeparator(*pErrorCode);
                }
                pathBuffer.append(suffix, *pErrorCode);
            }
        }

#ifdef UDATA_DEBUG
        fprintf(stderr, " -->  %s\n", pathBuffer.data());
#endif

        return pathBuffer.data();

    } while(path);

    /* fell way off the end */
    return NULL;
}